

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_sum(lyxp_set **args,uint32_t UNUSED_arg_count,lyxp_set *set,uint32_t options)

{
  undefined8 *puVar1;
  ushort *puVar2;
  undefined8 uVar3;
  ly_bool lVar4;
  LY_ERR ret__;
  LY_ERR LVar5;
  lyxp_set *plVar6;
  char *pcVar7;
  char *format;
  uint32_t uVar8;
  char **str_00;
  ly_ctx *plVar9;
  ulong uVar10;
  long lVar11;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  char *str;
  longdouble local_d4;
  lyxp_set set_item;
  
  if ((options & 0x1c) == 0) {
    set_fill_number(set,(longdouble)0);
    plVar6 = *args;
    if (plVar6->type != LYXP_SET_NODE_SET) {
      plVar9 = set->ctx;
      pcVar7 = print_set_type(plVar6);
      ly_vlog(plVar9,(char *)0x0,LYVE_XPATH,
              "Wrong type of argument #%d (%s) for the XPath function %s.",1,pcVar7,"sum(node-set)")
      ;
      return LY_EVALID;
    }
    uVar8 = plVar6->used;
    if (uVar8 != 0) {
      set_init(&set_item,set);
      set_item.type = LYXP_SET_NODE_SET;
      set_item.val.nodes = (lyxp_set_node *)calloc(1,0x10);
      if (set_item.val.nodes == (lyxp_set_node *)0x0) {
        ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","xpath_sum");
        return LY_EMEM;
      }
      set_item.used = 1;
      set_item.size = 1;
      lVar11 = 0;
      for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
        puVar1 = (undefined8 *)((long)&((plVar6->val).nodes)->node + lVar11);
        uVar3 = puVar1[1];
        (set_item.val.nodes)->node = (lyd_node *)*puVar1;
        (set_item.val.nodes)->type = (int)uVar3;
        (set_item.val.nodes)->pos = (int)((ulong)uVar3 >> 0x20);
        str_00 = &str;
        LVar5 = cast_node_set_to_string(&set_item,str_00);
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
        cast_string_to_number((longdouble *)str,(char *)str_00);
        local_d4 = in_ST0;
        free(str);
        (set->val).num = local_d4 + (set->val).num;
        plVar6 = *args;
        uVar8 = plVar6->used;
        lVar11 = lVar11 + 0x10;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
      }
      free(set_item.val.nodes);
    }
  }
  else {
    plVar6 = *args;
    if (plVar6->type == LYXP_SET_SCNODE_SET) {
      lVar11 = 0;
      for (uVar10 = 0; uVar10 < plVar6->used; uVar10 = uVar10 + 1) {
        if (*(int *)((long)&((plVar6->val).nodes)->pos + lVar11) == 2) {
          puVar2 = *(ushort **)((long)&((plVar6->val).nodes)->node + lVar11);
          if ((*puVar2 & 0xc) == 0) {
            plVar9 = set->ctx;
            pcVar7 = lys_nodetype2str(*puVar2);
            format = "Argument #1 of %s is a %s node \"%s\".";
          }
          else {
            lVar4 = warn_is_numeric_type(*(lysc_type **)(puVar2 + 0x30));
            if (lVar4 != '\0') goto LAB_001a53f8;
            plVar9 = set->ctx;
            pcVar7 = *(char **)(puVar2 + 0x14);
            format = "Argument #1 of %s is node \"%s\", not of numeric type.";
          }
          ly_log(plVar9,LY_LLWRN,LY_SUCCESS,format,"xpath_sum",pcVar7);
        }
LAB_001a53f8:
        plVar6 = *args;
        lVar11 = lVar11 + 0x18;
      }
    }
    set_scnode_clear_ctx(set,1);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_sum(struct lyxp_set **args, uint32_t UNUSED(arg_count), struct lyxp_set *set, uint32_t options)
{
    long double num;
    char *str;
    uint32_t i;
    struct lyxp_set set_item;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (args[0]->type == LYXP_SET_SCNODE_SET) {
            for (i = 0; i < args[0]->used; ++i) {
                if (args[0]->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX) {
                    sleaf = (struct lysc_node_leaf *)args[0]->val.scnodes[i].scnode;
                    if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                        LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__,
                                lys_nodetype2str(sleaf->nodetype), sleaf->name);
                    } else if (!warn_is_numeric_type(sleaf->type)) {
                        LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of numeric type.", __func__, sleaf->name);
                    }
                }
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    set_fill_number(set, 0);

    if (args[0]->type != LYXP_SET_NODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INARGTYPE, 1, print_set_type(args[0]), "sum(node-set)");
        return LY_EVALID;
    } else if (!args[0]->used) {
        return LY_SUCCESS;
    }

    set_init(&set_item, set);

    set_item.type = LYXP_SET_NODE_SET;
    set_item.val.nodes = calloc(1, sizeof *set_item.val.nodes);
    LY_CHECK_ERR_RET(!set_item.val.nodes, LOGMEM(set->ctx), LY_EMEM);

    set_item.used = 1;
    set_item.size = 1;

    for (i = 0; i < args[0]->used; ++i) {
        set_item.val.nodes[0] = args[0]->val.nodes[i];

        rc = cast_node_set_to_string(&set_item, &str);
        LY_CHECK_RET(rc);
        num = cast_string_to_number(str);
        free(str);
        set->val.num += num;
    }

    free(set_item.val.nodes);

    return LY_SUCCESS;
}